

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

void __thiscall
NNTreeIterator::insertAfter(NNTreeIterator *this,QPDFObjectHandle *key,QPDFObjectHandle *value)

{
  QPDFObjectHandle *key_00;
  NNTreeImpl *this_00;
  QPDF *qpdf;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  int iVar3;
  undefined8 extraout_RAX;
  iterator parent;
  int at;
  iterator result;
  iterator parent_00;
  allocator<char> local_109;
  QPDFObjectHandle items;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_e8;
  string local_d8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_98;
  iterator local_88;
  
  if (this->item_number < 0) {
    this_00 = this->impl;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)value);
    NNTreeImpl::insertFirst
              (&local_88,this_00,(QPDFObjectHandle *)&local_98,(QPDFObjectHandle *)&local_a8);
    ~NNTreeIterator(&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&this->impl->oh);
    deepen(this,(QPDFObjectHandle *)&local_b8,true,false);
    p_Var1 = &local_b8;
LAB_00126a03:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
    return;
  }
  key_00 = &this->node;
  (*(code *)**(undefined8 **)this->impl->details)();
  QPDFObjectHandle::getKey(&items,(string *)key_00);
  bVar2 = QPDFObjectHandle::isArray(&items);
  if (bVar2) {
    iVar3 = QPDFObjectHandle::getArrayNItems(&items);
    at = this->item_number + 2;
    if (at <= iVar3) {
      QPDFObjectHandle::insertItem(&items,at,key);
      QPDFObjectHandle::insertItem(&items,this->item_number + 3,value);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key_00);
      parent_00._M_node = (_List_node_base *)&this->path;
      parent._M_node = parent_00._M_node;
      if ((this->path).
          super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
          ._M_impl._M_node.super__List_node_base._M_next != parent_00._M_node) {
        parent._M_node =
             (this->path).
             super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
      }
      resetLimits(this,(QPDFObjectHandle *)&local_e8,parent);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_f8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key_00);
      if ((this->path).
          super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
          ._M_impl._M_node.super__List_node_base._M_next != parent_00._M_node) {
        parent_00._M_node =
             (this->path).
             super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
      }
      split(this,(QPDFObjectHandle *)&local_f8,parent_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
      increment(this,false);
      p_Var1 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&items.super_BaseHandle;
      goto LAB_00126a03;
    }
  }
  else {
    this = (NNTreeIterator *)this->impl->qpdf;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"node contains no items array",&local_109);
    ::error((QPDF *)this,key_00,&local_d8);
  }
  qpdf = this->impl->qpdf;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"insert: items array is too short",&local_109);
  ::error(qpdf,key_00,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
NNTreeIterator::insertAfter(QPDFObjectHandle key, QPDFObjectHandle value)
{
    if (!valid()) {
        QTC::TC("qpdf", "NNTree insertAfter inserts first");
        impl.insertFirst(key, value);
        deepen(impl.oh, true, false);
        return;
    }

    auto items = this->node.getKey(impl.details.itemsKey());
    if (!items.isArray()) {
        error(impl.qpdf, node, "node contains no items array");
    }
    if (items.getArrayNItems() < this->item_number + 2) {
        error(impl.qpdf, node, "insert: items array is too short");
    }
    items.insertItem(this->item_number + 2, key);
    items.insertItem(this->item_number + 3, value);
    resetLimits(this->node, lastPathElement());
    split(this->node, lastPathElement());
    increment(false);
}